

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<char16_t>::setCapacity(Vector<char16_t> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<char16_t> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<char16_t> newBuilder;
  size_t newSize_local;
  Vector<char16_t> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<char16_t>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<char16_t>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<char16_t>((ArrayBuilder<char16_t> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<char16_t>>(&this->builder);
  ArrayBuilder<char16_t>::addAll<kj::ArrayBuilder<char16_t>>
            ((ArrayBuilder<char16_t> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<char16_t>>((ArrayBuilder<char16_t> *)local_38);
  ArrayBuilder<char16_t>::operator=(&this->builder,pAVar2);
  ArrayBuilder<char16_t>::~ArrayBuilder((ArrayBuilder<char16_t> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }